

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O2

ostringstream * toml::detail::format_filename(ostringstream *oss,source_location *loc)

{
  ostream *poVar1;
  
  poVar1 = color::ansi::bold((ostream *)oss);
  poVar1 = color::ansi::blue(poVar1);
  poVar1 = std::operator<<(poVar1," --> ");
  poVar1 = color::ansi::reset(poVar1);
  poVar1 = color::ansi::bold(poVar1);
  poVar1 = std::operator<<(poVar1,(string *)&loc->file_name_);
  poVar1 = std::operator<<(poVar1,'\n');
  color::ansi::reset(poVar1);
  return oss;
}

Assistant:

TOML11_INLINE std::ostringstream&
format_filename(std::ostringstream& oss, const source_location& loc)
{
    // --> example.toml
    oss << color::bold << color::blue << " --> " << color::reset
        << color::bold << loc.file_name() << '\n' << color::reset;
    return oss;
}